

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O1

void WI_drawDeathmatchStats(void)

{
  double dVar1;
  DBot *pDVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  EColorRange EVar10;
  FTexture *pFVar11;
  BYTE *string;
  BYTE *pBVar12;
  undefined4 extraout_var;
  char *pcVar13;
  undefined8 *puVar14;
  uint x;
  int iVar15;
  player_t *ppVar16;
  code *__compar;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  FString leveltime;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  BYTE *local_b8;
  undefined8 local_b0;
  ulong local_a8;
  FTexture *local_a0;
  ulong local_98;
  int maxiconheight;
  int maxscorewidth;
  int maxnamewidth;
  char timer [9];
  player_t *sortedplayers [8];
  
  (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  pFVar11 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  iVar6 = WI_drawLF();
  HU_GetPlayerWidths(&maxnamewidth,&maxscorewidth,&maxiconheight);
  dVar1 = (pFVar11->Scale).Y;
  uVar17 = (uint)((double)((uint)pFVar11->Height * 2) / dVar1);
  uVar7 = (uint)((double)(pFVar11->TopOffset * 2) / dVar1);
  iVar18 = ((uVar17 & 1) + ((int)uVar17 >> 1)) - ((uVar7 & 1) + ((int)uVar7 >> 1));
  if (iVar18 <= maxiconheight) {
    iVar18 = maxiconheight;
  }
  uVar17 = SmallFont->FontHeight * CleanYfac;
  uVar7 = iVar18 * CleanYfac;
  if (iVar18 * CleanYfac < (int)uVar17) {
    uVar7 = uVar17;
  }
  local_a8 = (ulong)(uint)(iVar6 + CleanYfac);
  local_a0 = pFVar11;
  maxiconheight = iVar18;
  string = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DEATHS");
  pBVar12 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_FRAGS");
  iVar18 = CleanXfac;
  iVar21 = (maxscorewidth + 8) * CleanXfac;
  local_b8 = pBVar12;
  iVar8 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar6 = FFont::StringWidth(SmallFont,pBVar12);
  if (iVar6 < iVar8) {
    iVar6 = iVar8;
  }
  iVar22 = (maxnamewidth + iVar6 + 8) * CleanXfac + iVar21;
  iVar6 = FFont::StringWidth(SmallFont,string);
  pDVar4 = screen;
  pFVar3 = SmallFont;
  local_b0 = CONCAT44(extraout_var,iVar6);
  uVar19 = (iVar6 + 8) * CleanXfac + iVar22;
  local_98 = (ulong)uVar19;
  x = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar19) >> 1;
  iVar21 = iVar21 + x;
  iVar22 = iVar22 + x;
  iVar8 = x + uVar19;
  iVar24 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
  pcVar13 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  lVar20 = 0;
  iVar23 = (int)local_a8;
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar24,iVar21,iVar23,pcVar13,0x40001393,1,0);
  pBVar12 = local_b8;
  pDVar4 = screen;
  pFVar3 = SmallFont;
  iVar6 = FFont::StringWidth(SmallFont,local_b8);
  DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,iVar24,iVar22 - iVar6 * CleanXfac,iVar23,
                    (char *)pBVar12,0x40001393,1,0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar24,iVar8 - (int)local_b0 * CleanXfac,iVar23,
                    (char *)string,0x40001393,1,0);
  ppVar16 = (player_t *)&players;
  do {
    sortedplayers[lVar20] = ppVar16;
    lVar20 = lVar20 + 1;
    ppVar16 = ppVar16 + 1;
  } while (lVar20 != 8);
  if (teamplay.Value == false) {
    __compar = comparepoints;
  }
  else {
    __compar = compareteams;
  }
  iVar24 = (int)((uVar7 - uVar17) + 1) / 2;
  iVar6 = iVar23 + uVar17 + CleanYfac * 6;
  qsort(sortedplayers,8,8,__compar);
  lVar20 = 0;
  do {
    ppVar16 = sortedplayers[lVar20];
    iVar23 = (int)((long)&ppVar16[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3d;
    if (playeringame[iVar23] == true) {
      D_GetPlayerColor(iVar23,&h,&s,&v,(FPlayerColorSet **)0x0);
      HSVtoRGB(&r,&g,&b,h,s,v);
      iVar9 = (int)(r * 255.0);
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar15 = (int)(g * 255.0);
      if (0xfe < iVar15) {
        iVar15 = 0xff;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar19 = (uint)(b * 255.0);
      if (0xfe < (int)uVar19) {
        uVar19 = 0xff;
      }
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f4ccccd,screen,(ulong)(uVar19 | iVar15 << 8 | iVar9 << 0x10),(ulong)x,
                 (ulong)(uint)(iVar6 - iVar24),(ulong)(uint)((int)local_98 + CleanXfac * 8),
                 (ulong)uVar7);
      if (playerready[iVar23] == false) {
        pDVar2 = (ppVar16->Bot).field_0.p;
        if (pDVar2 != (DBot *)0x0) {
          if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049d01f;
          (ppVar16->Bot).field_0.p = (DBot *)0x0;
        }
      }
      else {
LAB_0049d01f:
        DCanvas::DrawTexture
                  ((DCanvas *)screen,local_a0,(double)(int)(x - (uint)local_a0->Width * CleanXfac),
                   (double)iVar6,0x40001393,1,0);
      }
      EVar10 = HU_GetRowColor(ppVar16,consoleplayer == iVar23);
      uVar19 = (ppVar16->mo->ScoreIcon).texnum;
      if (0 < (long)(int)uVar19) {
        if (uVar19 < TexMan.Textures.Count) {
          pFVar11 = TexMan.Textures.Array[(int)uVar19].Texture;
        }
        else {
          pFVar11 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar11,(double)(int)(x + iVar18 * 8),(double)iVar6,0x40001393,
                   1,0);
      }
      puVar5 = (undefined8 *)
               ((long)&((ppVar16->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((ppVar16->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1ea) * 0x18));
      do {
        puVar14 = puVar5;
        puVar5 = (undefined8 *)*puVar14;
      } while (*(int *)(puVar14 + 1) != 0x1ea);
      iVar9 = iVar6 + iVar24;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar10,iVar21,iVar9,
                        *(char **)(puVar14[2] + 0x28),0x40001393,1,0);
      WI_drawNum(SmallFont,iVar22,iVar9,cnt_frags[iVar23],0,false,EVar10);
      if (1 < ng_state) {
        WI_drawNum(SmallFont,iVar8,iVar9,cnt_deaths[iVar23],0,false,EVar10);
      }
      iVar6 = iVar6 + uVar7 + CleanYfac;
    }
    pDVar4 = screen;
    pFVar3 = SmallFont;
    lVar20 = lVar20 + 1;
    if (lVar20 == 8) {
      iVar18 = iVar6 + uVar17 + CleanYfac * 3;
      EVar10 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
      pcVar13 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
      DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,EVar10,iVar21,iVar18,pcVar13,0x40001393,1,0);
      WI_drawNum(SmallFont,iVar22,iVar18,total_frags,0,false,EVar10);
      if (3 < ng_state) {
        WI_drawNum(SmallFont,iVar8,iVar18,total_deaths,0,false,EVar10);
      }
      iVar6 = iVar18 + uVar17 + CleanYfac;
      iVar18 = plrs[me].stime;
      pcVar13 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
      FString::FString(&leveltime,pcVar13);
      FString::operator+=(&leveltime,": ");
      iVar18 = (int)(((long)iVar18 * 0x62) / 0xdac);
      mysnprintf(timer,9,"%02i:%02i:%02i",(ulong)(uint)(iVar18 / 0xe10),
                 (ulong)(uint)((iVar18 % 0xe10) / 0x3c),(ulong)(uint)(iVar18 % 0x3c));
      FString::operator+=(&leveltime,timer);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar10,x,iVar6,leveltime.Chars,0x40001393,1,0);
      FString::~FString(&leveltime);
      return;
    }
  } while( true );
}

Assistant:

void WI_drawDeathmatchStats ()
{
	int i, pnum, x, y, ypadding, height, lineheight;
	int maxnamewidth, maxscorewidth, maxiconheight;
	int pwidth = IntermissionFont->GetCharWidth('%');
	int icon_x, name_x, frags_x, deaths_x;
	int deaths_len;
	float h, s, v, r, g, b;
	EColorRange color;
	const char *text_deaths, *text_frags;
	FTexture *readyico = TexMan.FindTexture("READYICO");
	player_t *sortedplayers[MAXPLAYERS];

	// draw animated background
	WI_drawBackground();

	y = WI_drawLF();

	HU_GetPlayerWidths(maxnamewidth, maxscorewidth, maxiconheight);
	// Use the readyico height if it's bigger.
	height = readyico->GetScaledHeight() - readyico->GetScaledTopOffset();
	maxiconheight = MAX(height, maxiconheight);
	height = SmallFont->GetHeight() * CleanYfac;
	lineheight = MAX(height, maxiconheight * CleanYfac);
	ypadding = (lineheight - height + 1) / 2;
	y += CleanYfac;

	text_deaths = GStrings("SCORE_DEATHS");
	//text_color = GStrings("SCORE_COLOR");
	text_frags = GStrings("SCORE_FRAGS");

	icon_x = 8 * CleanXfac;
	name_x = icon_x + maxscorewidth * CleanXfac;
	frags_x = name_x + (maxnamewidth + MAX(SmallFont->StringWidth("XXXXX"), SmallFont->StringWidth(text_frags)) + 8) * CleanXfac;
	deaths_x = frags_x + ((deaths_len = SmallFont->StringWidth(text_deaths)) + 8) * CleanXfac;

	x = (SCREENWIDTH - deaths_x) >> 1;
	icon_x += x;
	name_x += x;
	frags_x += x;
	deaths_x += x;

	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;

	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_NAME"), DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, frags_x - SmallFont->StringWidth(text_frags)*CleanXfac, y, text_frags, DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, deaths_x - deaths_len*CleanXfac, y, text_deaths, DTA_CleanNoMove, true, TAG_DONE);
	y += height + 6 * CleanYfac;

	// Sort all players
	for (i = 0; i < MAXPLAYERS; i++)
	{
		sortedplayers[i] = &players[i];
	}

	if (teamplay)
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), compareteams);
	else
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), comparepoints);

	// Draw lines for each player
	for (i = 0; i < MAXPLAYERS; i++)
	{
		player_t *player = sortedplayers[i];
		pnum = int(player - players);

		if (!playeringame[pnum])
			continue;

		D_GetPlayerColor(pnum, &h, &s, &v, NULL);
		HSVtoRGB(&r, &g, &b, h, s, v);

		screen->Dim(MAKERGB(clamp(int(r*255.f), 0, 255), 
			clamp(int(g*255.f), 0, 255), 
			clamp(int(b*255.f), 0, 255)), 0.8f, x, y - ypadding, (deaths_x - x) + (8 * CleanXfac), lineheight);

		if (playerready[pnum] || player->Bot != NULL) // Bots are automatically assumed ready, to prevent confusion
			screen->DrawTexture(readyico, x - (readyico->GetWidth() * CleanXfac), y, DTA_CleanNoMove, true, TAG_DONE);

		color = (EColorRange)HU_GetRowColor(player, pnum == consoleplayer);
		if (player->mo->ScoreIcon.isValid())
		{
			FTexture *pic = TexMan[player->mo->ScoreIcon];
			screen->DrawTexture(pic, icon_x, y, DTA_CleanNoMove, true, TAG_DONE);
		}
		screen->DrawText(SmallFont, color, name_x, y + ypadding, player->userinfo.GetName(), DTA_CleanNoMove, true, TAG_DONE);
		WI_drawNum(SmallFont, frags_x, y + ypadding, cnt_frags[pnum], 0, false, color);
		if (ng_state >= 2)
		{
			WI_drawNum(SmallFont, deaths_x, y + ypadding, cnt_deaths[pnum], 0, false, color);
		}
		y += lineheight + CleanYfac;
	}

	// Draw "TOTAL" line
	y += height + 3 * CleanYfac;
	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;
	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_TOTAL"), DTA_CleanNoMove, true, TAG_DONE);
	WI_drawNum(SmallFont, frags_x, y, total_frags, 0, false, color);
	if (ng_state >= 4)
	{
		WI_drawNum(SmallFont, deaths_x, y, total_deaths, 0, false, color);
	}

	// Draw game time
	y += height + CleanYfac;

	int seconds = Tics2Seconds(plrs[me].stime);
	int hours = seconds / 3600;
	int minutes = (seconds % 3600) / 60;
	seconds = seconds % 60;

	FString leveltime = GStrings("SCORE_LVLTIME");
	leveltime += ": ";

	char timer[sizeof "HH:MM:SS"];
	mysnprintf(timer, sizeof(timer), "%02i:%02i:%02i", hours, minutes, seconds);
	leveltime += timer;

	screen->DrawText(SmallFont, color, x, y, leveltime, DTA_CleanNoMove, true, TAG_DONE);
}